

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O1

bool __thiscall HttpHeaderBase::addField(HttpHeaderBase *this,FieldType type,char *data)

{
  int iVar1;
  
  iVar1 = this->mNumFields;
  if ((long)iVar1 < 0x20) {
    this->mFields[iVar1].mType = type;
    HeaderField::setData(this->mFields + iVar1,data);
    this->mNumFields = this->mNumFields + 1;
    (this->mHeaderStr)._M_string_length = 0;
    *(this->mHeaderStr)._M_dataplus._M_p = '\0';
  }
  return iVar1 < 0x20;
}

Assistant:

bool HttpHeaderBase::addField(FieldMap::FieldType type, const char *data)
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (mNumFields >= kMaxFields)
		return false;
	
	mFields[mNumFields].mType = type;
	mFields[mNumFields].setData(data);
	mNumFields++;

	// Make sure we re-build the header if it has already been built.
	mHeaderStr.clear();
	
	return true;
}